

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZmqComms.cpp
# Opt level: O2

int __thiscall
helics::zeromq::ZmqComms::replyToIncomingMessage(ZmqComms *this,message_t *msg,socket_t *sock)

{
  void *data;
  size_t size;
  size_t in_RCX;
  int iVar1;
  int in_R8D;
  string str;
  ActionMessage resp;
  ActionMessage M;
  
  data = zmq::message_t::data(msg);
  size = zmq::message_t::size(msg);
  ActionMessage::ActionMessage(&M,data,size);
  if (((M.messageAction == cmd_protocol_priority) || (M.messageAction == cmd_protocol_big)) ||
     (M.messageAction == cmd_protocol)) {
    if (M.messageID == 0x16570bf) {
      iVar1 = -1;
      goto LAB_0026e24c;
    }
    NetworkCommsInterface::generateReplyToIncomingMessage
              (&resp,&this->super_NetworkCommsInterface,&M);
    if ((M.flags & 0x40) == 0) {
      ActionMessage::to_string_abi_cxx11_(&str,&resp);
    }
    else {
      ActionMessage::to_json_string_abi_cxx11_(&str,&resp);
    }
    zmq::detail::socket_base::send(&sock->super_socket_base,(int)&str,(void *)0x0,in_RCX,in_R8D);
  }
  else {
    std::function<void_(helics::ActionMessage_&&)>::operator()
              (&(this->super_NetworkCommsInterface).super_CommsInterface.ActionCallback,&M);
    ActionMessage::ActionMessage(&resp,cmd_priority_ack);
    if ((M.flags & 0x40) == 0) {
      ActionMessage::to_string_abi_cxx11_(&str,&resp);
    }
    else {
      ActionMessage::to_json_string_abi_cxx11_(&str,&resp);
    }
    zmq::detail::socket_base::send(&sock->super_socket_base,(int)&str,(void *)0x0,in_RCX,in_R8D);
  }
  iVar1 = 0;
  std::__cxx11::string::~string((string *)&str);
  ActionMessage::~ActionMessage(&resp);
LAB_0026e24c:
  ActionMessage::~ActionMessage(&M);
  return iVar1;
}

Assistant:

int ZmqComms::replyToIncomingMessage(zmq::message_t& msg, zmq::socket_t& sock)
{
    ActionMessage M(static_cast<std::byte*>(msg.data()), msg.size());
    bool useJson = checkActionFlag(M, use_json_serialization_flag);
    if (isProtocolCommand(M)) {
        if (M.messageID == CLOSE_RECEIVER) {
            return (-1);
        }
        auto reply = generateReplyToIncomingMessage(M);
        auto str = (useJson) ? reply.to_json_string() : reply.to_string();

        sock.send(str);
        return 0;
    }

    ActionCallback(std::move(M));
    ActionMessage resp(CMD_PRIORITY_ACK);
    auto str = (useJson) ? resp.to_json_string() : resp.to_string();
    sock.send(str);
    return 0;
}